

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.cpp
# Opt level: O2

value * stdlib::subtract(vector<parser::thing_*,_std::allocator<parser::thing_*>_> *args,context *c)

{
  pointer pptVar1;
  value *pvVar2;
  undefined8 extraout_RAX;
  int i;
  ulong uVar3;
  _func_int **local_98;
  value *local_90;
  vector<eval::value_*,_std::allocator<eval::value_*>_> e_args;
  string local_68 [32];
  string local_48 [32];
  
  e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar3 = 1;
      pptVar1 = (args->super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(args->
                            super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pptVar1 >> 3);
      uVar3 = uVar3 + 1) {
    local_90 = eval::eval(pptVar1[uVar3],c);
    std::vector<eval::value*,std::allocator<eval::value*>>::emplace_back<eval::value*>
              ((vector<eval::value*,std::allocator<eval::value*>> *)&e_args,&local_90);
  }
  if ((*e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
        super__Vector_impl_data._M_start)->ty == NUMBER) {
    local_98 = (*e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
                 super__Vector_impl_data._M_start)[1]._vptr_value;
    uVar3 = 1;
    while( true ) {
      if ((ulong)((long)e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) {
        pvVar2 = (value *)operator_new(0x18);
        pvVar2->super_thing = EVALED;
        pvVar2->ty = NUMBER;
        pvVar2->_vptr_value = (_func_int **)&PTR_to_string_abi_cxx11__0010fc30;
        pvVar2[1]._vptr_value = local_98;
        std::_Vector_base<eval::value_*,_std::allocator<eval::value_*>_>::~_Vector_base
                  (&e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>);
        return pvVar2;
      }
      if (e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3]->ty != NUMBER) break;
      local_98 = (_func_int **)
                 ((double)local_98 -
                 (double)e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar3][1]._vptr_value);
      uVar3 = uVar3 + 1;
    }
    std::__cxx11::string::string
              (local_48,"ALL ARGUMENTS TO subtract MUST BE NUMBERS",(allocator *)&local_90);
    exit((int)local_48);
  }
  std::__cxx11::string::string(local_68,"SUBTRACT ONLY WORKS WITH NUMBERS.",(allocator *)&local_90);
  exit((int)local_68);
  std::__cxx11::string::~string(local_68);
  std::_Vector_base<eval::value_*,_std::allocator<eval::value_*>_>::~_Vector_base
            (&e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

eval::value *stdlib::subtract(std::vector<parser::thing *> args, context &c) {

  std::vector<eval::value *> e_args;
  for (int i = 1; i < args.size(); i++) {
    e_args.push_back(eval::eval(args[i], c));
  }

  if (e_args[0]->get_type()==eval::type::NUMBER) {

    double total = (static_cast<eval::number *>(e_args[0]))->get_val();

    for (int i = 1; i < e_args.size(); i++) {

      if (e_args[i]->get_type()!=eval::type::NUMBER)
        stdlib::exit("ALL ARGUMENTS TO subtract MUST BE NUMBERS");

      eval::number *n = static_cast<eval::number *>(e_args[i]);
      total -= n->get_val();

    }

    return new eval::number(total);
  }

  stdlib::exit("SUBTRACT ONLY WORKS WITH NUMBERS.");

}